

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O3

uint __thiscall CVmHashFuncCI::compute_hash(CVmHashFuncCI *this,char *s,size_t l)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint __c;
  
  if (l == 0) {
    uVar2 = 0;
  }
  else {
    sVar3 = 0;
    uVar2 = 0;
    do {
      __c = (uint)s[sVar3];
      if ((-1 < s[sVar3]) && (iVar1 = islower(__c), iVar1 != 0)) {
        __c = toupper(__c);
      }
      uVar2 = uVar2 + (__c & 0xff);
      sVar3 = sVar3 + 1;
    } while (l != sVar3);
  }
  return uVar2;
}

Assistant:

unsigned int CVmHashFuncCI::compute_hash(const char *s, size_t l) const
{
    uint acc;

    /*
     *   Add up all the character values in the string, converting all
     *   characters to upper-case.
     */
    for (acc = 0 ; l != 0 ; ++s, --l)
    {
        uchar c;

        c = (uchar)(is_lower(*s) ? to_upper(*s) : *s);
        acc += c;
    }

    /* return the accumulated value */
    return acc;
}